

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

void __thiscall Graph::auxBranchActiveLoss(Graph *this,Vertex *no,double *soma)

{
  Edge *pEVar1;
  double dVar2;
  
  for (pEVar1 = no->edgesList; pEVar1 != (Edge *)0x0; pEVar1 = pEVar1->nextEdge) {
    if (pEVar1->closed == false) {
      pEVar1->activePowerFlow = 0.0;
      pEVar1->reactivePowerFlow = 0.0;
      pEVar1->activeLoss = 0.0;
      pEVar1->reactiveLoss = 0.0;
    }
    else {
      dVar2 = Vertex::getActivePower(pEVar1->destiny);
      *soma = dVar2 + pEVar1->activeLoss + *soma;
      auxBranchActiveLoss(this,pEVar1->destiny,soma);
    }
  }
  return;
}

Assistant:

void Graph::auxBranchActiveLoss(Vertex *no, double &soma){
    for(Edge *a= no->getEdgesList(); a != NULL; a= a->getNext()){

        //nao descer por arcos com chave aberta
        while(a!=NULL && a->isClosed() == false){

            //nao tem fluxo nem perda em arcos abertos
            a->setActiveFlow(0.0);
            a->setReactiveFlow(0.0);
            a->setActiveLoss(0.0);
            a->setReactiveLoss(0.0);

            a = a->getNext();
        }
        if(a==NULL)
            break;

        soma+= a->getDestiny()->getActivePower() + a->getActiveLoss();
        auxBranchActiveLoss(a->getDestiny(), soma);
    }
}